

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

void __thiscall IR::IndirOpnd::~IndirOpnd(IndirOpnd *this)

{
  (this->super_Opnd)._vptr_Opnd = (_func_int **)&PTR_DummyFunction_013751b8;
  if (this->m_baseOpnd != (RegOpnd *)0x0) {
    Opnd::UnUse(&this->m_baseOpnd->super_Opnd);
    Opnd::Free(&this->m_baseOpnd->super_Opnd,this->m_func);
  }
  if (this->m_indexOpnd != (RegOpnd *)0x0) {
    Opnd::UnUse(&this->m_indexOpnd->super_Opnd);
    Opnd::Free(&this->m_indexOpnd->super_Opnd,this->m_func);
  }
  return;
}

Assistant:

IndirOpnd::~IndirOpnd()
{
    if (m_baseOpnd != nullptr)
    {
        m_baseOpnd->UnUse();
        m_baseOpnd->Free(m_func);
    }
    if (m_indexOpnd != nullptr)
    {
        m_indexOpnd->UnUse();
        m_indexOpnd->Free(m_func);
    }
}